

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::JsonReporter::testRunEnded(JsonReporter *this,TestRunStats *runStats)

{
  JsonReporter *this_00;
  JsonValueWriter *in_RDI;
  StringRef SVar1;
  Counts *in_stack_00000178;
  JsonObjectWriter *in_stack_00000180;
  JsonObjectWriter totals;
  JsonReporter *in_stack_fffffffffffffa90;
  char *local_560;
  size_t local_558;
  JsonObjectWriter local_550 [18];
  StringRef local_3a0;
  JsonObjectWriter local_390 [18];
  StringRef local_1d0;
  JsonObjectWriter local_1c0 [17];
  undefined1 local_28 [40];
  
  endArray(in_stack_fffffffffffffa90);
  this_00 = (JsonReporter *)
            std::
            stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
            ::top((stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
                   *)0x1a3ad8);
  local_1d0 = operator____sr((char *)this_00,(size_t)in_RDI);
  JsonObjectWriter::write(local_1c0,(int)this_00,local_1d0.m_start,local_1d0.m_size);
  JsonValueWriter::writeObject(in_RDI);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a3b46);
  local_3a0 = operator____sr((char *)this_00,(size_t)in_RDI);
  JsonObjectWriter::write(local_390,(int)local_28,local_3a0.m_start,local_3a0.m_size);
  JsonValueWriter::writeObject(in_RDI);
  writeCounts(in_stack_00000180,in_stack_00000178);
  JsonObjectWriter::~JsonObjectWriter((JsonObjectWriter *)this_00);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a3bda);
  SVar1 = operator____sr((char *)this_00,(size_t)in_RDI);
  local_560 = SVar1.m_start;
  local_558 = SVar1.m_size;
  JsonObjectWriter::write(local_550,(int)local_28,local_560,local_558);
  JsonValueWriter::writeObject(in_RDI);
  writeCounts(in_stack_00000180,in_stack_00000178);
  JsonObjectWriter::~JsonObjectWriter((JsonObjectWriter *)this_00);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a3c59);
  JsonObjectWriter::~JsonObjectWriter((JsonObjectWriter *)this_00);
  endObject(this_00);
  return;
}

Assistant:

void JsonReporter::testRunEnded(TestRunStats const& runStats) {
        assert( isInside( Writer::Array ) );
        // End "test-cases"
        endArray();

        {
            auto totals =
                m_objectWriters.top().write( "totals"_sr ).writeObject();
            writeCounts( totals.write( "assertions"_sr ).writeObject(),
                         runStats.totals.assertions );
            writeCounts( totals.write( "test-cases"_sr ).writeObject(),
                         runStats.totals.testCases );
        }

        // End the "test-run" object
        endObject();
    }